

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoundMap.cpp
# Opt level: O2

void __thiscall AI::SoundMap::SoundMap(SoundMap *this,Vector2<int> gridSize,float resolution)

{
  (this->gridSize).x = gridSize.x;
  (this->gridSize).y = gridSize.y;
  this->resolution = resolution;
  (this->grid).super__Vector_base<AI::Cell,_std::allocator<AI::Cell>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->grid).super__Vector_base<AI::Cell,_std::allocator<AI::Cell>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->grid).super__Vector_base<AI::Cell,_std::allocator<AI::Cell>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->sources).super__Vector_base<AI::SoundSource,_std::allocator<AI::SoundSource>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->sources).super__Vector_base<AI::SoundSource,_std::allocator<AI::SoundSource>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->sources).super__Vector_base<AI::SoundSource,_std::allocator<AI::SoundSource>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->nextSourceId = 0;
  std::vector<AI::Cell,_std::allocator<AI::Cell>_>::resize
            (&this->grid,(ulong)(uint)(gridSize.y * gridSize.x));
  return;
}

Assistant:

SoundMap::SoundMap(Vector2<int> gridSize, float resolution)
		: gridSize{gridSize}, resolution{resolution}
	{
		unsigned int size = gridSize.x * gridSize.y;
		
		grid.resize(size);		
	}